

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

int __thiscall
CVmObjFileName::getp_getAbsolutePath
          (CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  ushort uVar1;
  long lVar2;
  void *pvVar3;
  int iVar4;
  vm_obj_id_t vVar5;
  ulong uVar6;
  char *buf;
  size_t sVar7;
  char *buf_00;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_110 [2];
  long local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  
  if (oargc == (uint *)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = (long)(int)*oargc;
  }
  if (getp_getAbsolutePath(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getAbsolutePath();
  }
  iVar4 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getAbsolutePath::desc);
  if (iVar4 == 0) {
    pcVar10 = (this->super_CVmObject).ext_;
    uVar1 = *(ushort *)(pcVar10 + 6);
    G_err_frame::__tls_init();
    local_108 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_110;
    local_110[0] = _setjmp(&local_f8);
    if (local_110[0] == 0) {
      pcVar10 = pcVar10 + 8;
      iVar4 = fn_is_file_absolute(pcVar10);
      if (iVar4 == 0) {
        sVar7 = strlen(G_file_path_X);
        uVar6 = sVar7 + uVar1 + 0x20;
        sVar8 = 0x1000;
        if (0x1000 < uVar6) {
          sVar8 = uVar6;
        }
        buf = lib_alloc_str(sVar8);
        fn_build_full_path(buf,sVar8,G_file_path_X,pcVar10,1);
        pcVar10 = buf;
      }
      else {
        buf = (char *)0x0;
      }
      sVar7 = strlen(pcVar10);
      sVar8 = 0x1000;
      if (0x1000 < sVar7 + 0x20) {
        sVar8 = sVar7 + 0x20;
      }
      buf_00 = lib_alloc_str(sVar8);
      iVar4 = CVmNetFile::is_net_mode();
      if ((iVar4 == 0) && (iVar4 = os_get_abs_filename(buf_00,sVar8,pcVar10), iVar4 != 0)) {
        sVar7 = strlen(buf_00);
        vVar5 = CVmObjString::create(0,buf_00,sVar7);
        retval->typ = VM_OBJ;
        (retval->val).obj = vVar5;
      }
      else {
        retval->typ = VM_NIL;
      }
    }
    else {
      buf_00 = (char *)0x0;
      buf = buf_00;
    }
    if (-1 < (short)local_110[0]) {
      local_110[0] = local_110[0] | 0x8000;
      lib_free_str(buf);
      lib_free_str(buf_00);
    }
    lVar2 = local_108;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar2;
    if ((local_110[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar3 = local_100;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar3;
      err_rethrow();
    }
    if ((local_110[0] & 2) != 0) {
      free(local_100);
    }
    sp_ = sp_ + -lVar9;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_getAbsolutePath(VMG_ vm_obj_id_t self,
                                         vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get our local filename string */
    const char *fname = get_ext()->get_str();
    size_t fnamel = get_ext()->get_len();

    /* we haven't allocated any strings yet */
    char *buf = 0, *outbuf = 0;

    err_try
    {
        /* 
         *   if it's not absolute already, combine it with our internal
         *   working directory to get the fully qualified path
         */
        const char *src = fname;
        if (!fn_is_file_absolute(vmg_ fname))
        {
            /* allocate space for the combined path */
            size_t buflen = fnamel + strlen(G_file_path) + 32;
            if (buflen < OSFNMAX)
                buflen = OSFNMAX;

            /* build the combined path */
            buf = lib_alloc_str(buflen);
            fn_build_full_path(vmg_ buf, buflen, G_file_path, fname, TRUE);

            /* use this as the new source path */
            src = buf;
        }

        /* 
         *   Even though the name should already be absolute, run it through
         *   os_get_abs_filename() anyway, since that will convert the name
         *   to a more canonical format on many systems. 
         */

        /* figure how much space we'll need, adding some padding */
        size_t buflen = strlen(src) + 32;
        if (buflen < OSFNMAX)
            buflen = OSFNMAX;

        /* allocate the buffer and do the conversion */
        outbuf = lib_alloc_str(buflen);
        if (fn_get_abs_filename(vmg_ outbuf, buflen, src))
        {
            /* success - return the result string */
            retval->set_obj(CVmObjString::create(
                vmg_ FALSE, outbuf, strlen(outbuf)));
        }
        else
        {
            /* failure - return nil */
            retval->set_nil();
        }
    }